

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Runner::~Runner(Runner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IReporter *pIVar2;
  pointer pcVar3;
  pointer ppSVar4;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__Runner_001d64d0;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__Runner_001d6538;
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar2,&this->m_totals);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,this->m_prevRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,0);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,this->m_prevResultCapture);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,this->m_prevConfig);
  pcVar3 = (this->m_lastAssertionInfo).capturedExpression._M_dataplus._M_p;
  paVar1 = &(this->m_lastAssertionInfo).capturedExpression.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_lastAssertionInfo).lineInfo.file._M_dataplus._M_p;
  paVar1 = &(this->m_lastAssertionInfo).lineInfo.file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_lastAssertionInfo).macroName._M_dataplus._M_p;
  paVar1 = &(this->m_lastAssertionInfo).macroName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::~vector
            (&this->m_assertionResults);
  ppSVar4 = (this->m_scopedInfos).
            super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->m_scopedInfos).
                                  super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  pIVar2 = (this->m_reporter).m_p;
  if (pIVar2 != (IReporter *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  AssertionResult::~AssertionResult(&this->m_lastResult);
  return;
}

Assistant:

virtual ~Runner() {
            m_reporter->EndTesting( m_totals );
            m_context.setRunner( m_prevRunner );
            m_context.setConfig( NULL );
            m_context.setResultCapture( m_prevResultCapture );
            m_context.setConfig( m_prevConfig );
        }